

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O3

_Bool COSE_Sign_Free(HCOSE_SIGN h)

{
  _Bool _Var1;
  COSE_SignMessage *pMessage;
  
  if (h != (HCOSE_SIGN)0x0) {
    _Var1 = _COSE_IsInList(SignRoot,(COSE *)h);
    if (_Var1) {
      if (*(int *)(h + 0x10) < 2) {
        _COSE_RemoveFromList(&SignRoot,(COSE *)h);
        _COSE_Sign_Release((COSE_SignMessage *)h);
        free(h);
      }
      else {
        *(int *)(h + 0x10) = *(int *)(h + 0x10) + -1;
      }
      _Var1 = true;
    }
    else {
      _Var1 = false;
    }
    return _Var1;
  }
  return false;
}

Assistant:

bool COSE_Sign_Free(HCOSE_SIGN h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_SignMessage * pMessage = (COSE_SignMessage *)h;

	if (!IsValidSignHandle(h)) return false;

	//  Check reference counting
	if (pMessage->m_message.m_refCount > 1) {
		pMessage->m_message.m_refCount--;
		return true;
	}

	_COSE_RemoveFromList(&SignRoot, &pMessage->m_message);

#ifdef USE_CBOR_CONTEXT
	context = &pMessage->m_message.m_allocContext;
#endif

	_COSE_Sign_Release(pMessage);

	COSE_FREE(pMessage, context);

	return true;
}